

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_api.c
# Opt level: O1

MPP_RET avs2d_reset(void *decoder)

{
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","In.","avs2d_reset");
  }
  avs2d_dpb_flush((Avs2dCtx_t *)decoder);
  avs2d_reset_parser((Avs2dCtx_t *)decoder);
  *(undefined8 *)((long)decoder + 0x58) = 0;
  *(undefined8 *)((long)decoder + 0x60) = 0;
  *(undefined1 *)((long)decoder + 0x68) = 0;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","Out.","avs2d_reset");
  }
  return MPP_OK;
}

Assistant:

MPP_RET avs2d_reset(void *decoder)
{
    MPP_RET ret = MPP_OK;
    Avs2dCtx_t *p_dec = (Avs2dCtx_t *)decoder;

    AVS2D_PARSE_TRACE("In.");

    //!< flush dpb
    avs2d_dpb_flush(p_dec);

    //!< reset parser parameters
    avs2d_reset_parser(p_dec);

    //!< reset decoder parameters
    p_dec->pkt_no      = 0;
    p_dec->frame_no    = 0;
    p_dec->has_get_eos = 0;

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}